

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_mail_client.c
# Opt level: O0

int write_and_get_response(mbedtls_net_context *sock_fd,uchar *buf,size_t len)

{
  uint uVar1;
  int iVar2;
  ulong local_d0;
  size_t idx;
  size_t i;
  uchar local_b8 [4];
  char code [4];
  uchar data [128];
  int ret;
  size_t len_local;
  uchar *buf_local;
  mbedtls_net_context *sock_fd_local;
  
  local_d0 = 0;
  printf("\n%s");
  if ((len == 0) || (uVar1 = mbedtls_net_send(sock_fd,buf,len), 0 < (int)uVar1)) {
    while( true ) {
      memset(local_b8,0,0x80);
      uVar1 = mbedtls_net_recv(sock_fd,local_b8,0x7f);
      if ((int)uVar1 < 1) break;
      printf("\n%s");
      for (idx = 0; idx < (ulong)(long)(int)uVar1; idx = idx + 1) {
        if (local_b8[idx] == '\n') {
          if ((((local_d0 == 4) && ('/' < i._4_1_)) && (i._4_1_ < ':')) && (i._7_1_ == ' ')) {
            i._7_1_ = 0;
            iVar2 = atoi((char *)((long)&i + 4));
            return iVar2;
          }
          local_d0 = 0;
        }
        else if (local_d0 < 4) {
          local_b8[local_d0 - 4] = local_b8[idx];
          local_d0 = local_d0 + 1;
        }
      }
    }
    printf("failed\n  ! read returned %d\n\n",(ulong)uVar1);
  }
  else {
    printf(" failed\n  ! mbedtls_ssl_write returned %d\n\n",(ulong)uVar1);
  }
  return -1;
}

Assistant:

static int write_and_get_response( mbedtls_net_context *sock_fd, unsigned char *buf, size_t len )
{
    int ret;
    unsigned char data[128];
    char code[4];
    size_t i, idx = 0;

    mbedtls_printf("\n%s", buf);
    if( len && ( ret = mbedtls_net_send( sock_fd, buf, len ) ) <= 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ssl_write returned %d\n\n", ret );
            return -1;
    }

    do
    {
        len = sizeof( data ) - 1;
        memset( data, 0, sizeof( data ) );
        ret = mbedtls_net_recv( sock_fd, data, len );

        if( ret <= 0 )
        {
            mbedtls_printf( "failed\n  ! read returned %d\n\n", ret );
            return -1;
        }

        data[len] = '\0';
        mbedtls_printf("\n%s", data);
        len = ret;
        for( i = 0; i < len; i++ )
        {
            if( data[i] != '\n' )
            {
                if( idx < 4 )
                    code[ idx++ ] = data[i];
                continue;
            }

            if( idx == 4 && code[0] >= '0' && code[0] <= '9' && code[3] == ' ' )
            {
                code[3] = '\0';
                return atoi( code );
            }

            idx = 0;
        }
    }
    while( 1 );
}